

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O1

void BuilderTests<TestHeapBuilder,_TestHeapBuilder>::builder_swap_before_finish_test(bool run)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  Offset<MyGame::Example::Monster> root;
  Offset<MyGame::Example::Monster> root_00;
  undefined7 in_register_00000039;
  TestHeapBuilder src;
  TestHeapBuilder dst;
  string local_140;
  FlatBufferBuilder local_120;
  FlatBufferBuilder local_a0;
  
  if ((int)CONCAT71(in_register_00000039,run) != 0) {
    local_120.buf_.allocator_ = (Allocator *)operator_new(8);
    (local_120.buf_.allocator_)->_vptr_Allocator = (_func_int **)&PTR__Allocator_00201c00;
    local_120.buf_.own_allocator_ = true;
    local_120.buf_.initial_size_ = 0x800;
    local_120.buf_.max_size_ = 0x7fffffff;
    local_120.buf_.buffer_minalign_ = 8;
    local_120.buf_.reserved_ = 0;
    local_120.buf_.size_ = 0;
    local_120.length_of_64_bit_region_ = 0;
    local_120.nested = false;
    local_120.finished = false;
    local_120.buf_.scratch_._0_6_ = 0;
    local_120._78_8_ = 0;
    local_120.buf_.buf_ = (uint8_t *)0x0;
    local_120.buf_.cur_._0_6_ = 0;
    local_120.buf_.cur_._6_2_ = 0;
    local_120.minalign_ = 1;
    local_120.force_defaults_ = false;
    local_120.dedup_vtables_ = true;
    local_120.string_pool = (StringOffsetMap *)0x0;
    root = populate1(&local_120);
    uVar2 = local_120.buf_.size_;
    local_a0.buf_.allocator_ = (Allocator *)operator_new(8);
    (local_a0.buf_.allocator_)->_vptr_Allocator = (_func_int **)&PTR__Allocator_00201c00;
    local_a0.buf_.own_allocator_ = true;
    local_a0.buf_.initial_size_ = 0x800;
    local_a0.buf_.max_size_ = 0x7fffffff;
    local_a0.buf_.buffer_minalign_ = 8;
    local_a0.buf_.reserved_ = 0;
    local_a0.buf_.size_ = 0;
    local_a0.length_of_64_bit_region_ = 0;
    local_a0.nested = false;
    local_a0.finished = false;
    local_a0.buf_.buf_ = (uint8_t *)0x0;
    local_a0.buf_.cur_._0_6_ = 0;
    local_a0.buf_.cur_._6_2_ = 0;
    local_a0.buf_.scratch_._0_6_ = 0;
    local_a0._78_8_ = 0;
    local_a0.minalign_ = 1;
    local_a0.force_defaults_ = false;
    local_a0.dedup_vtables_ = true;
    local_a0.string_pool = (StringOffsetMap *)0x0;
    root_00 = populate2(&local_a0);
    uVar3 = local_a0.buf_.size_;
    flatbuffers::FlatBufferBuilderImpl<false>::Swap(&local_120,&local_a0);
    flatbuffers::FlatBufferBuilderImpl<false>::Finish(&local_120,root_00.o,(char *)0x0,false);
    flatbuffers::FlatBufferBuilderImpl<false>::Finish(&local_a0,root.o,(char *)0x0,false);
    TestEq<bool,bool>(uVar3 < local_120.buf_.size_,true,"\'src.GetSize() > size2\' != \'true\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
                      ,0xb1,
                      "static void BuilderTests<TestHeapBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                     );
    TestEq<bool,bool>(uVar2 < local_a0.buf_.size_,true,"\'dst.GetSize() > size1\' != \'true\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
                      ,0xb2,
                      "static void BuilderTests<TestHeapBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                     );
    paVar1 = &local_140.field_2;
    local_140.field_2._M_allocated_capacity._0_4_ = 0x706d49;
    local_140._M_string_length = 3;
    local_140._M_dataplus._M_p = (pointer)paVar1;
    bVar4 = release_n_verify(&local_120,&local_140,Color_Green);
    TestEq<bool,bool>(true,bVar4,"\'true\' != \'release_n_verify(src, m2_name(), m2_color())\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
                      ,0xb3,
                      "static void BuilderTests<TestHeapBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                     );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    local_140.field_2._M_allocated_capacity = 0x6d65647265627943;
    local_140.field_2._8_2_ = 0x6e6f;
    local_140._M_string_length = 10;
    local_140.field_2._M_local_buf[10] = '\0';
    local_140._M_dataplus._M_p = (pointer)paVar1;
    bVar4 = release_n_verify(&local_a0,&local_140,Color_Red);
    TestEq<bool,bool>(true,bVar4,"\'true\' != \'release_n_verify(dst, m1_name(), m1_color())\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
                      ,0xb4,
                      "static void BuilderTests<TestHeapBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                     );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_a0);
    flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_120);
  }
  return;
}

Assistant:

static void builder_swap_before_finish_test(
      bool run = std::is_same<DestBuilder, SrcBuilder>::value) {
    /// Swap is allowed only when lhs and rhs are the same concrete type.
    if (run) {
      SrcBuilder src;
      auto root_offset1 = populate1(src);
      auto size1 = src.GetSize();
      DestBuilder dst;
      auto root_offset2 = populate2(dst);
      auto size2 = dst.GetSize();
      src.Swap(dst);
      src.Finish(root_offset2);
      dst.Finish(root_offset1);
      TEST_EQ_FUNC(src.GetSize() > size2, true);
      TEST_EQ_FUNC(dst.GetSize() > size1, true);
      TEST_ASSERT_FUNC(release_n_verify(src, m2_name(), m2_color()));
      TEST_ASSERT_FUNC(release_n_verify(dst, m1_name(), m1_color()));
    }
  }